

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O0

void __thiscall
kj::_::anon_unknown_13::FatalThrowExpectation::onFatalException
          (FatalThrowExpectation *this,Exception *exception)

{
  bool bVar1;
  Type TVar2;
  Type *params_2;
  ArrayPtr<const_char> *params_2_00;
  StringPtr haystack;
  bool local_51;
  bool _kj_shouldLog_1;
  StringPtr *expectedSubstring;
  bool _kj_shouldLog;
  Type *expectedType;
  Exception *exception_local;
  FatalThrowExpectation *this_local;
  
  params_2 = readMaybe<kj::Exception::Type>(&this->type);
  if ((params_2 != (Type *)0x0) && (TVar2 = Exception::getType(exception), TVar2 != *params_2)) {
    expectedSubstring._7_1_ = Debug::shouldLog(ERROR);
    while (expectedSubstring._7_1_ != false) {
      Debug::log<char_const(&)[30],kj::Exception&,kj::Exception::Type&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/test-helpers.c++"
                 ,0x52,ERROR,"\"threw exception of wrong type\", exception, *expectedType",
                 (char (*) [30])"threw exception of wrong type",exception,params_2);
      expectedSubstring._7_1_ = false;
    }
    _exit(1);
  }
  params_2_00 = &readMaybe<kj::StringPtr>(&this->message)->content;
  if (params_2_00 != (ArrayPtr<const_char> *)0x0) {
    haystack = Exception::getDescription(exception);
    bVar1 = hasSubstring(haystack,(StringPtr)*params_2_00);
    if (!bVar1) {
      local_51 = Debug::shouldLog(ERROR);
      while (local_51 != false) {
        Debug::log<char_const(&)[35],kj::Exception&,kj::StringPtr&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/test-helpers.c++"
                   ,0x58,ERROR,
                   "\"threw exception with wrong message\", exception, *expectedSubstring",
                   (char (*) [35])"threw exception with wrong message",exception,
                   (StringPtr *)params_2_00);
        local_51 = false;
      }
      _exit(1);
    }
  }
  _exit(0);
}

Assistant:

virtual void onFatalException(Exception&& exception) {
    KJ_IF_MAYBE(expectedType, type) {
      if (exception.getType() != *expectedType) {
        KJ_LOG(ERROR, "threw exception of wrong type", exception, *expectedType);
        _exit(1);
      }
    }
    KJ_IF_MAYBE(expectedSubstring, message) {
      if (!hasSubstring(exception.getDescription(), *expectedSubstring)) {
        KJ_LOG(ERROR, "threw exception with wrong message", exception, *expectedSubstring);
        _exit(1);
      }
    }
    _exit(0);
  }